

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  pointer __result;
  pointer __first;
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  function<double_(int)> func;
  vector<double,_std::allocator<double>_> output;
  vector<int,_std::allocator<int>_> test;
  vector<double,_std::allocator<double>_> expectedMap;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  vector<double,_std::allocator<double>_> local_88;
  vector<int,_std::allocator<int>_> local_70;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  vector<double,_std::allocator<double>_> local_30;
  
  local_58._M_unused._M_object = (void *)0x300000001;
  local_58._8_8_ = 0x3200000022;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_70,__l,(allocator_type *)local_a8._M_pod_data);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test map...",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  local_48 = (code *)0x4051000000000000;
  uStack_40 = 0x4059000000000000;
  local_58._M_unused._M_member_pointer = 0x4000000000000000;
  local_58._8_8_ = 0x4018000000000000;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_58;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_30,__l_00,(allocator_type *)local_a8._M_pod_data);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<double_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/map/main.cpp:18:33)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<double_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/map/main.cpp:18:33)>
             ::_M_manager;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_88,
             (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)local_58._M_pod_data);
  __first = local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  __result = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::function<double_(int)>::function
            ((function<double_(int)> *)&local_58,(function<double_(int)> *)&local_a8);
  std::
  transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::function<double(int)>>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)__first,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)__result,
             (function<double_(int)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
    bVar3 = local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar3) {
LAB_00102443:
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"passed!",7);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_98 != (code *)0x0) {
          (*local_98)(&local_a8,&local_a8,__destroy_functor);
        }
        if (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return 0;
      }
    }
    else if ((*local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start ==
              *local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start) &&
            (pdVar1 = local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
            pdVar2 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
            !NAN(*local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start) &&
            !NAN(*local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start))) {
      do {
        pdVar2 = pdVar2 + 1;
        pdVar1 = pdVar1 + 1;
        bVar3 = pdVar1 == local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
        if (bVar3) goto LAB_00102443;
      } while ((*pdVar1 == *pdVar2) && (!NAN(*pdVar1) && !NAN(*pdVar2)));
    }
  }
  __assert_fail("expectedMap==output",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/map/main.cpp"
                ,0x14,"int main()");
}

Assistant:

int main(){

    
  
  vector<int> test={1, 3, 34, 50};
  
  cout << "Test map..." << endl;
  vector<double> expectedMap={2, 6, 68, 100};
  function< double(int) > func= [] (const int & element){return 2.0*element;};   
  vector<double> output= Functional::map( test,  func );
  assert(expectedMap==output);
  cout << "passed!" << endl;
 
  return 0;

}